

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# BumpAllocator.h
# Opt level: O3

ConditionalPropertyExprSyntax * __thiscall
slang::BumpAllocator::
emplace<slang::syntax::ConditionalPropertyExprSyntax,slang::syntax::ConditionalPropertyExprSyntax_const&>
          (BumpAllocator *this,ConditionalPropertyExprSyntax *args)

{
  undefined4 uVar1;
  ConditionalPropertyExprSyntax *pCVar2;
  long lVar3;
  ConditionalPropertyExprSyntax *pCVar4;
  byte bVar5;
  
  bVar5 = 0;
  pCVar2 = (ConditionalPropertyExprSyntax *)((ulong)(this->head->current + 7) & 0xfffffffffffffff8);
  if ((ConditionalPropertyExprSyntax *)this->endPtr < pCVar2 + 1) {
    pCVar2 = (ConditionalPropertyExprSyntax *)allocateSlow(this,0x60,8);
  }
  else {
    this->head->current = (byte *)(pCVar2 + 1);
  }
  pCVar4 = pCVar2;
  for (lVar3 = 0xc; lVar3 != 0; lVar3 = lVar3 + -1) {
    uVar1 = *(undefined4 *)&(args->super_PropertyExprSyntax).super_SyntaxNode.field_0x4;
    (pCVar4->super_PropertyExprSyntax).super_SyntaxNode.kind =
         (args->super_PropertyExprSyntax).super_SyntaxNode.kind;
    *(undefined4 *)&(pCVar4->super_PropertyExprSyntax).super_SyntaxNode.field_0x4 = uVar1;
    args = (ConditionalPropertyExprSyntax *)((long)args + (ulong)bVar5 * -0x10 + 8);
    pCVar4 = (ConditionalPropertyExprSyntax *)((long)pCVar4 + (ulong)bVar5 * -0x10 + 8);
  }
  return pCVar2;
}

Assistant:

T* emplace(Args&&... args) {
        static_assert(std::is_trivially_destructible_v<T>);
        return new (allocate(sizeof(T), alignof(T))) T(std::forward<Args>(args)...);
    }